

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O1

QSize __thiscall QPushButton::sizeHint(QPushButton *this)

{
  QPushButtonPrivate *this_00;
  QPushButtonPrivate *this_01;
  long lVar1;
  undefined1 *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  QDialog *pQVar7;
  long lVar8;
  QStyle *pQVar9;
  undefined8 uVar10;
  QSize QVar11;
  int iVar12;
  int iVar13;
  Representation RVar14;
  QPushButtonPrivate *d;
  long in_FS_OFFSET;
  bool bVar15;
  QFontMetrics fm;
  int local_d8;
  int local_d4;
  undefined1 *local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  QSize QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if ((-1 < (this_00->super_QAbstractButtonPrivate).sizeHint.wd.m_i) &&
     (-1 < (this_00->super_QAbstractButtonPrivate).sizeHint.ht.m_i)) {
    bVar4 = this_00->field_0x2c8;
    bVar3 = bVar4 & 3;
    if (bVar3 == 2) {
      pQVar7 = QPushButtonPrivate::dialogParent(this_00);
      bVar15 = pQVar7 == (QDialog *)0x0;
    }
    else {
      bVar15 = bVar3 == 0;
    }
    if (((bVar4 & 0x40) == 0) != !bVar15) {
      QVar11 = (this_00->super_QAbstractButtonPrivate).sizeHint;
      goto LAB_00473581;
    }
  }
  this_01 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar4 = this_01->field_0x2c8 & 3;
  if (bVar4 == 2) {
    pQVar7 = QPushButtonPrivate::dialogParent(this_01);
    bVar15 = pQVar7 == (QDialog *)0x0;
  }
  else {
    bVar15 = bVar4 == 0;
  }
  this_00->field_0x2c8 = this_00->field_0x2c8 & 0xbf | !bVar15 << 6;
  QWidget::ensurePolished((QWidget *)this);
  local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_a8);
  (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))
            (this,(QStyleOptionButton *)local_a8);
  lVar8 = QMetaObject::cast((QObject *)&QDialogButtonBox::staticMetaObject);
  if (lVar8 == 0) {
    bVar15 = false;
  }
  else {
    pQVar9 = QWidget::style((QWidget *)this);
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x47,0,this,0);
    bVar15 = iVar6 != 0;
  }
  QAbstractButton::icon((QAbstractButton *)local_c8);
  cVar5 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)local_c8);
  if ((bVar15) || (iVar6 = 0, RVar14.m_i = 0, cVar5 == '\0')) {
    iVar6 = QStack_40.wd.m_i + 4;
    RVar14.m_i = 0;
    if (0 < QStack_40.ht.m_i) {
      RVar14.m_i = QStack_40.ht.m_i;
    }
  }
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractButton::text((QString *)local_c8,&this->super_QAbstractButton);
  puVar2 = local_b8;
  uVar10 = local_c8._0_8_;
  if (local_b8 == (undefined1 *)0x0) {
    local_c8._0_8_ = (QArrayData *)0x0;
    local_c8._8_8_ = L"XXXX";
    local_b8 = (undefined1 *)0x4;
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
      }
    }
  }
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics
            ((QFontMetrics *)&local_d0,&((this->super_QAbstractButton).super_QWidget.data)->fnt);
  uVar10 = QFontMetrics::size((int)(QFontMetrics *)&local_d0,(QString *)0x800,(int)local_c8,
                              (int *)0x0);
  iVar13 = 0;
  if (iVar6 == 0) {
    iVar13 = (int)uVar10;
  }
  iVar12 = (int)((ulong)uVar10 >> 0x20);
  if (iVar12 < RVar14.m_i) {
    iVar12 = RVar14.m_i;
  }
  if (RVar14.m_i == 0) {
    RVar14.m_i = iVar12;
  }
  if (puVar2 != (undefined1 *)0x0) {
    RVar14.m_i = iVar12;
    iVar13 = (int)uVar10;
  }
  iVar13 = iVar13 + iVar6;
  puStack_90._0_4_ = (int)local_98 + -1 + iVar13;
  puStack_90._4_4_ = (int)((ulong)local_98 >> 0x20) + -1 + RVar14.m_i;
  lVar8 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  lVar1 = *(long *)(lVar8 + 0x2b8);
  if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) && (*(long *)(lVar8 + 0x2c0) != 0)) {
    pQVar9 = QWidget::style((QWidget *)this);
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,2,local_a8,this);
    iVar13 = iVar6 + iVar13;
  }
  pQVar9 = QWidget::style((QWidget *)this);
  local_d8 = iVar13;
  local_d4 = RVar14.m_i;
  QVar11 = (QSize)(**(code **)(*(long *)pQVar9 + 0xe8))(pQVar9,0,local_a8,&local_d8,this);
  (this_00->super_QAbstractButtonPrivate).sizeHint = QVar11;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_d0);
  if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
    }
  }
  QIcon::~QIcon(&local_48);
  if (pQStack_60 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_60,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_a8);
LAB_00473581:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar11;
  }
  __stack_chk_fail();
}

Assistant:

QSize QPushButton::sizeHint() const
{
    Q_D(const QPushButton);
    if (d->sizeHint.isValid() && d->lastAutoDefault == autoDefault())
        return d->sizeHint;
    d->lastAutoDefault = autoDefault();
    ensurePolished();

    int w = 0, h = 0;

    QStyleOptionButton opt;
    initStyleOption(&opt);

    // calculate contents size...
#if !defined(QT_NO_ICON) && QT_CONFIG(dialogbuttonbox)
    bool showButtonBoxIcons = qobject_cast<QDialogButtonBox*>(parentWidget())
                          && style()->styleHint(QStyle::SH_DialogButtonBox_ButtonsHaveIcons, nullptr, this);

    if (!icon().isNull() || showButtonBoxIcons) {
        int ih = opt.iconSize.height();
        int iw = opt.iconSize.width() + 4;
        w += iw;
        h = qMax(h, ih);
    }
#endif
    QString s(text());
    bool empty = s.isEmpty();
    if (empty)
        s = QStringLiteral("XXXX");
    QFontMetrics fm = fontMetrics();
    QSize sz = fm.size(Qt::TextShowMnemonic, s);
    if (!empty || !w)
        w += sz.width();
    if (!empty || !h)
        h = qMax(h, sz.height());
    opt.rect.setSize(QSize(w, h)); // PM_MenuButtonIndicator depends on the height
#if QT_CONFIG(menu)
    if (menu())
        w += style()->pixelMetric(QStyle::PM_MenuButtonIndicator, &opt, this);
#endif
    d->sizeHint = style()->sizeFromContents(QStyle::CT_PushButton, &opt, QSize(w, h), this);
    return d->sizeHint;
}